

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O1

void references::scheme::add_globals(environment *env)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  environment *peVar6;
  mapped_type *pmVar7;
  key_type local_b8;
  undefined1 local_98 [8];
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> local_70;
  proc_type local_58;
  environment *peStack_50;
  vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> local_48;
  
  local_98 = (undefined1  [8])&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"nil","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_98);
  pmVar7->type = nil;
  std::__cxx11::string::_M_assign((string *)&pmVar7->val);
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator=
            (&pmVar7->list,
             (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
             &DAT_001312c8);
  uVar5 = uRam00000000001312ec;
  uVar4 = _DAT_001312e8;
  uVar3 = uRam00000000001312e4;
  *(undefined4 *)&pmVar7->proc = _DAT_001312e0;
  *(undefined4 *)((long)&pmVar7->proc + 4) = uVar3;
  *(undefined4 *)&pmVar7->env = uVar4;
  *(undefined4 *)((long)&pmVar7->env + 4) = uVar5;
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"#f","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_98);
  pmVar7->type = false_sym;
  std::__cxx11::string::_M_assign((string *)&pmVar7->val);
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator=
            (&pmVar7->list,
             (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
             &DAT_00131228);
  uVar5 = uRam000000000013124c;
  uVar4 = _DAT_00131248;
  uVar3 = uRam0000000000131244;
  *(undefined4 *)&pmVar7->proc = _DAT_00131240;
  *(undefined4 *)((long)&pmVar7->proc + 4) = uVar3;
  *(undefined4 *)&pmVar7->env = uVar4;
  *(undefined4 *)((long)&pmVar7->env + 4) = uVar5;
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"#t","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_98);
  pmVar7->type = true_sym;
  std::__cxx11::string::_M_assign((string *)&pmVar7->val);
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator=
            (&pmVar7->list,
             (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
             &DAT_00131278);
  peVar6 = _DAT_00131298;
  pmVar7->proc = _DAT_00131290;
  pmVar7->env = peVar6;
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  pcVar1 = local_88._M_local_buf + 8;
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_append;
  peStack_50 = (environment *)0x0;
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"append","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_head;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"head","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_tail;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"tail","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_cons;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"cons","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_length;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"length","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_list;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"list","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_nullp;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"null?","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_add;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"+","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_sub;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_mul;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"*","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_div;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_greater;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,">","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_less;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"<","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  local_98._0_4_ = 3;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = proc_less_equal;
  peStack_50 = (environment *)0x0;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_90 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"<=","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_b8);
  pmVar7->type = local_98._0_4_;
  std::__cxx11::string::operator=((string *)&pmVar7->val,(string *)&local_90);
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->list).
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar7->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_48);
  pmVar7->proc = local_58;
  pmVar7->env = peStack_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::~vector
            (&local_70);
  if (local_90 != pcVar1) {
    operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
  }
  return;
}

Assistant:

void add_globals(environment & env)
{
	env["nil"] = nil;   env["#f"] = false_sym;  env["#t"] = true_sym;
	env["append"] = cell(&proc_append);   env["head"] = cell(&proc_head);
	env["tail"] = cell(&proc_tail);      env["cons"] = cell(&proc_cons);
	env["length"] = cell(&proc_length);   env["list"] = cell(&proc_list);
	env["null?"] = cell(&proc_nullp);    env["+"] = cell(&proc_add);
	env["-"] = cell(&proc_sub);      env["*"] = cell(&proc_mul);
	env["/"] = cell(&proc_div);      env[">"] = cell(&proc_greater);
	env["<"] = cell(&proc_less);     env["<="] = cell(&proc_less_equal);
}